

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassFactoryRegistry.cpp
# Opt level: O2

void __thiscall
Lodtalk::ClassFactoryRegistry::registerVMContext(ClassFactoryRegistry *this,VMContext *context)

{
  __node_base *p_Var1;
  
  p_Var1 = &(this->factories)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    VMContext::instanceClassFactory(context,(AbstractClassFactory *)p_Var1[1]._M_nxt);
  }
  return;
}

Assistant:

void ClassFactoryRegistry::registerVMContext(VMContext *context)
{
    for (auto factory : factories)
        context->instanceClassFactory(factory);
}